

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  global_State *pgVar2;
  uint h;
  int iVar3;
  TString *pTVar4;
  anon_union_8_2_b887aad4_for_u *paVar5;
  int iVar6;
  anon_union_8_2_b887aad4_for_u *paVar7;
  
  if (l < 0x29) {
    pgVar2 = L->l_G;
    h = luaS_hash(str,l,pgVar2->seed);
    iVar6 = (pgVar2->strt).size;
    paVar7 = (anon_union_8_2_b887aad4_for_u *)((pgVar2->strt).hash + (int)(iVar6 - 1U & h));
    paVar5 = paVar7;
    while (pTVar4 = paVar5->hnext, pTVar4 != (TString *)0x0) {
      if ((pTVar4->shrlen == l) && (iVar3 = bcmp(str,pTVar4->contents,l), iVar3 == 0)) {
        if (((pgVar2->currentwhite ^ 0x18) & pTVar4->marked) == 0) {
          return pTVar4;
        }
        pTVar4->marked = pTVar4->marked ^ 0x18;
        return pTVar4;
      }
      paVar5 = &pTVar4->u;
    }
    iVar3 = (pgVar2->strt).nuse;
    if (iVar6 <= iVar3) {
      if (iVar3 == 0x7fffffff) {
        luaC_fullgc(L,1);
        if ((pgVar2->strt).nuse == 0x7fffffff) {
          luaD_throw(L,4);
        }
        iVar6 = (pgVar2->strt).size;
      }
      if (iVar6 < 0x40000000) {
        luaS_resize(L,iVar6 * 2);
        iVar6 = (pgVar2->strt).size;
      }
      paVar7 = (anon_union_8_2_b887aad4_for_u *)((pgVar2->strt).hash + (int)(iVar6 - 1U & h));
    }
    pTVar4 = createstrobj(L,l,4,h);
    memcpy(pTVar4->contents,str,l);
    pTVar4->shrlen = (lu_byte)l;
    (pTVar4->u).hnext = (TString *)*(TString **)paVar7;
    paVar7->hnext = pTVar4;
    piVar1 = &(pgVar2->strt).nuse;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffde < l) {
      luaM_toobig(L);
    }
    pTVar4 = luaS_createlngstrobj(L,l);
    memcpy(pTVar4->contents,str,l);
  }
  return pTVar4;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l_unlikely(l >= (MAX_SIZE - sizeof(TString))/sizeof(char)))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}